

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O1

bool __thiscall
args::ArgumentParser::
Complete<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
          (ArgumentParser *this,
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          it,__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             end)

{
  char __rhs;
  undefined1 *puVar1;
  _Alloc_hider _Var2;
  undefined8 uVar3;
  int iVar4;
  OptionType OVar5;
  undefined4 extraout_var;
  ulong uVar7;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  runtime_error *this_00;
  Matcher *this_01;
  EitherFlag *this_02;
  pointer __rhs_00;
  iterator __end6;
  long *plVar8;
  iterator __begin6;
  string *choice;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs_01;
  bool bVar9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  choices;
  string arg;
  vector<args::FlagBase_*,_std::allocator<args::FlagBase_*>_> flags;
  vector<args::Command_*,_std::allocator<args::Command_*>_> commands;
  undefined1 local_f8 [8];
  _Alloc_hider local_f0;
  undefined1 local_e8 [8];
  undefined1 local_e0 [24];
  undefined1 local_c8 [32];
  undefined1 local_a8 [32];
  long *local_88;
  long *local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  long *local_60;
  long *local_58;
  long *local_48;
  long *local_40;
  long *plVar6;
  
  if ((this->readCompletion & it._M_current + 1 == end._M_current) == 0) {
    return false;
  }
  iVar4 = (*(this->super_Command).super_Group.super_Base._vptr_Base[8])();
  plVar6 = (long *)CONCAT44(extraout_var,iVar4);
  (*(this->super_Command).super_Group.super_Base._vptr_Base[5])(&local_48,this);
  OVar5 = ParseOption(this,it._M_current,true);
  if (local_48 == local_40) {
LAB_0013df5e:
    if ((plVar6 != (long *)0x0) && ((*(byte *)(plVar6 + 1) & 0x40) == 0)) {
      if ((char)plVar6[0x13] == '\x01') {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_f8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(plVar6 + 0x10));
      }
      else {
        (**(code **)(*plVar6 + 0x80))(local_f8,plVar6,&this->helpParams);
      }
      _Var2._M_p = local_f0._M_p;
      choice = (string *)CONCAT62(local_f8._2_6_,CONCAT11(local_f8[1],local_f8[0]));
      bVar9 = choice == (string *)local_f0._M_p;
      for (; choice != (string *)_Var2._M_p; choice = choice + 1) {
        AddCompletionReply(this,it._M_current,choice);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_f8);
      if (OVar5 == Positional && bVar9) goto LAB_0013e497;
    }
  }
  else {
    plVar8 = local_48;
    if ((OVar5 == Positional) || ((it._M_current)->_M_string_length == 0)) {
      for (; plVar8 != local_40; plVar8 = plVar8 + 1) {
        if ((*(byte *)(*plVar8 + 8) & 0x40) == 0) {
          AddCompletionReply(this,it._M_current,(string *)(*plVar8 + 0x68));
        }
      }
      goto LAB_0013e497;
    }
    if (local_48 == local_40) goto LAB_0013df5e;
    do {
      if ((*(byte *)(*plVar8 + 8) & 0x40) == 0) {
        AddCompletionReply(this,it._M_current,(string *)(*plVar8 + 0x68));
      }
      plVar8 = plVar8 + 1;
    } while (plVar8 != local_40);
  }
  (*(this->super_Command).super_Group.super_Base._vptr_Base[9])(&local_60,this);
  local_88 = local_58;
  if (local_60 != local_58) {
    local_e0._16_8_ = &this->longprefix;
    plVar6 = local_60;
    do {
      local_80 = plVar6;
      if ((*(byte *)(*plVar6 + 8) & 0x40) == 0) {
        this_01 = (Matcher *)(*plVar6 + 0xa0);
        Matcher::GetShortOrAny((EitherFlag *)local_f8,this_01);
        EitherFlag::str((string *)local_c8,(EitherFlag *)local_f8,&this->shortprefix,
                        (string *)local_e0._16_8_);
        bVar9 = AddCompletionReply(this,it._M_current,(string *)local_c8);
        if ((EitherFlag *)local_c8._0_8_ != (EitherFlag *)(local_c8 + 0x10)) {
          operator_delete((void *)local_c8._0_8_);
        }
        if ((string *)local_f0._M_p != (string *)local_e0) {
          operator_delete(local_f0._M_p);
        }
        if (!bVar9) {
          Matcher::GetFlagStrings
                    ((vector<args::EitherFlag,_std::allocator<args::EitherFlag>_> *)local_c8,this_01
                    );
          uVar3 = local_c8._8_8_;
          this_02 = (EitherFlag *)local_c8._0_8_;
          if (local_c8._0_8_ != local_c8._8_8_) {
            do {
              EitherFlag::str((string *)local_f8,this_02,&this->shortprefix,
                              (string *)local_e0._16_8_);
              bVar9 = AddCompletionReply(this,it._M_current,(string *)local_f8);
              puVar1 = (undefined1 *)CONCAT62(local_f8._2_6_,CONCAT11(local_f8[1],local_f8[0]));
              if (puVar1 != local_e8) {
                operator_delete(puVar1);
              }
              this_02 = this_02 + 1;
            } while (!bVar9 && this_02 != (EitherFlag *)uVar3);
          }
          std::vector<args::EitherFlag,_std::allocator<args::EitherFlag>_>::~vector
                    ((vector<args::EitherFlag,_std::allocator<args::EitherFlag>_> *)local_c8);
        }
      }
      plVar6 = local_80 + 1;
    } while (plVar6 != local_88);
  }
  if ((OVar5 == LongFlag) && (this->allowJoinedLongValue == true)) {
    uVar7 = 0xffffffffffffffff;
    if ((this->longseparator)._M_string_length != 0) {
      uVar7 = std::__cxx11::string::find
                        ((char *)it._M_current,(ulong)(this->longseparator)._M_dataplus._M_p,0);
    }
    if (uVar7 != 0xffffffffffffffff) {
      std::__cxx11::string::string((string *)local_c8,(string *)it._M_current,0,uVar7);
      std::__cxx11::string::substr((ulong)local_a8,(ulong)local_c8);
      local_f8[0] = false;
      local_f8[1] = '\0';
      local_f0._M_p = (pointer)local_e0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f0,local_a8._0_8_,(pointer)(local_a8._0_8_ + local_a8._8_8_));
      iVar4 = (*(this->super_Command).super_Group.super_Base._vptr_Base[7])(this,local_f8);
      plVar6 = (long *)CONCAT44(extraout_var_00,iVar4);
      if ((string *)local_f0._M_p != (string *)local_e0) {
        operator_delete(local_f0._M_p);
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8._0_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_a8 + 0x10)) {
        operator_delete((void *)local_a8._0_8_);
      }
      if (plVar6 != (long *)0x0) {
        if ((char)plVar6[0x13] == '\x01') {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_78,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(plVar6 + 0x10));
        }
        else {
          (**(code **)(*plVar6 + 0x80))(&local_78,plVar6,&this->helpParams);
        }
        if (local_78.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_78.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          __rhs_00 = local_78.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          do {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_a8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_c8,&this->longseparator);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_f8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_a8,__rhs_00);
            AddCompletionReply(this,it._M_current,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_f8);
            puVar1 = (undefined1 *)CONCAT62(local_f8._2_6_,CONCAT11(local_f8[1],local_f8[0]));
            if (puVar1 != local_e8) {
              operator_delete(puVar1);
            }
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8._0_8_
                != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_a8 + 0x10)) {
              operator_delete((void *)local_a8._0_8_);
            }
            __rhs_00 = __rhs_00 + 1;
          } while (__rhs_00 !=
                   local_78.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_78);
      }
      if ((EitherFlag *)local_c8._0_8_ != (EitherFlag *)(local_c8 + 0x10)) {
        operator_delete((void *)local_c8._0_8_);
      }
    }
  }
  else if ((OVar5 == ShortFlag) && (this->allowJoinedShortValue == true)) {
    uVar7 = (this->shortprefix)._M_string_length;
    if (uVar7 + 1 < (it._M_current)->_M_string_length) {
      if ((it._M_current)->_M_string_length <= uVar7) {
        std::__throw_out_of_range_fmt
                  ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)");
      }
      __rhs = ((it._M_current)->_M_dataplus)._M_p[uVar7];
      local_f8[0] = true;
      local_e8 = (undefined1  [8])0x0;
      local_e0[0] = '\0';
      local_f8[1] = __rhs;
      local_f0._M_p = (pointer)local_e0;
      iVar4 = (*(this->super_Command).super_Group.super_Base._vptr_Base[7])(this,local_f8);
      plVar6 = (long *)CONCAT44(extraout_var_01,iVar4);
      if ((string *)local_f0._M_p != (string *)local_e0) {
        operator_delete(local_f0._M_p);
      }
      if (plVar6 != (long *)0x0) {
        if ((char)plVar6[0x13] == '\x01') {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_a8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(plVar6 + 0x10));
        }
        else {
          (**(code **)(*plVar6 + 0x80))(local_a8,plVar6,&this->helpParams);
        }
        if (local_a8._0_8_ != local_a8._8_8_) {
          local_e0._16_8_ = &this->shortprefix;
          __rhs_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_a8._0_8_;
          do {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_c8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_e0._16_8_,__rhs);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_f8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_c8,__rhs_01);
            AddCompletionReply(this,it._M_current,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_f8);
            puVar1 = (undefined1 *)CONCAT62(local_f8._2_6_,CONCAT11(local_f8[1],local_f8[0]));
            if (puVar1 != local_e8) {
              operator_delete(puVar1);
            }
            if ((EitherFlag *)local_c8._0_8_ != (EitherFlag *)(local_c8 + 0x10)) {
              operator_delete((void *)local_c8._0_8_);
            }
            __rhs_01 = __rhs_01 + 1;
          } while (__rhs_01 !=
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_a8._8_8_);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_a8);
      }
    }
  }
  if (local_60 != (long *)0x0) {
    operator_delete(local_60);
  }
LAB_0013e497:
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  CompletionFlag::Get_abi_cxx11_((string *)local_f8,this->completion);
  std::runtime_error::runtime_error(this_00,(string *)local_f8);
  *(undefined ***)this_00 = &PTR__runtime_error_0017a6d0;
  __cxa_throw(this_00,&Completion::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool Complete(It it, It end)
            {
                auto nextIt = it;
                if (!readCompletion || (++nextIt != end))
                {
                    return false;
                }

                const auto &chunk = *it;
                auto pos = GetNextPositional();
                std::vector<Command *> commands = GetCommands();
                const auto optionType = ParseOption(chunk, true);

                if (!commands.empty() && (chunk.empty() || optionType == OptionType::Positional))
                {
                    for (auto &cmd : commands)
                    {
                        if ((cmd->GetOptions() & Options::HiddenFromCompletion) == Options::None)
                        {
                            AddCompletionReply(chunk, cmd->Name());
                        }
                    }
                } else
                {
                    bool hasPositionalCompletion = true;

                    if (!commands.empty())
                    {
                        for (auto &cmd : commands)
                        {
                            if ((cmd->GetOptions() & Options::HiddenFromCompletion) == Options::None)
                            {
                                AddCompletionReply(chunk, cmd->Name());
                            }
                        }
                    } else if (pos)
                    {
                        if ((pos->GetOptions() & Options::HiddenFromCompletion) == Options::None)
                        {
                            auto choices = pos->HelpChoices(helpParams);
                            hasPositionalCompletion = !choices.empty() || optionType != OptionType::Positional;
                            for (auto &choice : choices)
                            {
                                AddCompletionReply(chunk, choice);
                            }
                        }
                    }

                    if (hasPositionalCompletion)
                    {
                        auto flags = GetAllFlags();
                        for (auto flag : flags)
                        {
                            if ((flag->GetOptions() & Options::HiddenFromCompletion) != Options::None)
                            {
                                continue;
                            }

                            auto &matcher = flag->GetMatcher();
                            if (!AddCompletionReply(chunk, matcher.GetShortOrAny().str(shortprefix, longprefix)))
                            {
                                for (auto &flagName : matcher.GetFlagStrings())
                                {
                                    if (AddCompletionReply(chunk, flagName.str(shortprefix, longprefix)))
                                    {
                                        break;
                                    }
                                }
                            }
                        }

                        if (optionType == OptionType::LongFlag && allowJoinedLongValue)
                        {
                            const auto separator = longseparator.empty() ? chunk.npos : chunk.find(longseparator);
                            if (separator != chunk.npos)
                            {
                                std::string arg(chunk, 0, separator);
                                if (auto flag = this->Match(arg.substr(longprefix.size())))
                                {
                                    for (auto &choice : flag->HelpChoices(helpParams))
                                    {
                                        AddCompletionReply(chunk, arg + longseparator + choice);
                                    }
                                }
                            }
                        } else if (optionType == OptionType::ShortFlag && allowJoinedShortValue)
                        {
                            if (chunk.size() > shortprefix.size() + 1)
                            {
                                auto arg = chunk.at(shortprefix.size());
                                //TODO: support -abcVALUE where a and b take no value
                                if (auto flag = this->Match(arg))
                                {
                                    for (auto &choice : flag->HelpChoices(helpParams))
                                    {
                                        AddCompletionReply(chunk, shortprefix + arg + choice);
                                    }
                                }
                            }
                        }
                    }
                }

#ifndef ARGS_NOEXCEPT
                throw Completion(completion->Get());
#else
                return true;
#endif
            }